

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfNamedBufferStorage(ErrorsTest *this)

{
  GLubyte GVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *pCVar8;
  TestContext *pTVar9;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  reference pvVar12;
  undefined4 *puVar13;
  Enum<int,_2UL> EVar14;
  value_type local_3e4;
  GetNameFunc p_Stack_3e0;
  GLuint tmp_buffer_1;
  int local_3d8;
  Enum<int,_2UL> local_3d0;
  MessageBuilder local_3c0;
  MessageBuilder local_240;
  value_type local_c0;
  uint local_bc;
  GLuint tmp_buffer;
  GLuint i_2;
  GLenum error;
  GLsizei i_1;
  GLsizeiptr max_possible_size;
  uint local_a0;
  GLsizei max_pointer_unsigned_bits;
  GLuint possibly_invalid_bit;
  GLuint i;
  GLuint bits_count;
  GLuint invalid_bits;
  GLuint valid_bits;
  GLuint local_7c;
  undefined1 local_78 [4];
  GLuint not_a_buffer_name;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> too_much_buffers;
  GLuint local_20;
  GLubyte dummy_data [4];
  GLuint buffer;
  bool internal_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  dummy_data[3] = '\x01';
  dummy_data[2] = '\0';
  local_20 = 0;
  memset((void *)((long)&too_much_buffers.c.
                         super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node + 4),0,4);
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>> *)local_78);
  local_7c = 0;
  do {
    local_7c = local_7c + 1;
    cVar2 = (**(code **)(lVar7 + 0xc68))();
  } while (cVar2 != '\0');
  (*this->m_pNamedBufferStorage)
            (local_7c,4,
             (GLvoid *)
             ((long)&too_much_buffers.c.
                     super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4),2);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x502,
                           " if buffer is not the name of an existing buffer object.");
  dummy_data[3] = bVar3 & dummy_data[3];
  (**(code **)(lVar7 + 0x3b8))(1,&local_20);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x123e);
  (*this->m_pNamedBufferStorage)
            (local_20,-1,
             (GLvoid *)
             ((long)&too_much_buffers.c.
                     super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4),0x88ea);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501," if size is negative.");
  dummy_data[3] = bVar3 & dummy_data[3];
  (*this->m_pNamedBufferStorage)
            (local_20,0,
             (GLvoid *)
             ((long)&too_much_buffers.c.
                     super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4),0x88ea);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501," if size zero.");
  dummy_data[3] = bVar3 & dummy_data[3];
  (**(code **)(lVar7 + 0x438))(1,&local_20);
  local_20 = 0;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x124f);
  bits_count = 0x3c3;
  pCVar8 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar8,"GL_ARB_sparse_buffer");
  if (bVar3) {
    bits_count = bits_count | 0x400;
  }
  pCVar8 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(pCVar8,"GL_NV_gpu_multicast");
  if (!bVar3) {
    pCVar8 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar8,"GL_NVX_linked_gpu_multicast");
    if (!bVar3) goto LAB_011bdb65;
  }
  bits_count = bits_count | 0x800;
LAB_011bdb65:
  i = bits_count ^ 0xffffffff;
  possibly_invalid_bit = 0x20;
  for (max_pointer_unsigned_bits = 0; (uint)max_pointer_unsigned_bits < possibly_invalid_bit;
      max_pointer_unsigned_bits = max_pointer_unsigned_bits + 1) {
    local_a0 = 1 << ((byte)max_pointer_unsigned_bits & 0x1f);
    if ((i & local_a0) != 0) {
      (**(code **)(lVar7 + 0x3b8))(1,&local_20);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glCreateBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x1270);
      (*this->m_pNamedBufferStorage)
                (local_20,4,
                 (GLvoid *)
                 ((long)&too_much_buffers.c.
                         super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node + 4),local_a0);
      bVar3 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501,
                               " if flags has any bits set other than DYNAMIC_STORAGE_BIT, MAP_READ_BIT, MAP_WRITE_BIT, MAP_PERSISTENT_BIT, MAP_COHERENT_BIT or CLIENT_STORAGE_BIT."
                              );
      dummy_data[3] = bVar3 & dummy_data[3];
      (**(code **)(lVar7 + 0x438))(1,&local_20);
      local_20 = 0;
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glDeleteBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x127f);
    }
  }
  (**(code **)(lVar7 + 0x3b8))(1,&local_20);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1288);
  (*this->m_pNamedBufferStorage)
            (local_20,4,
             (GLvoid *)
             ((long)&too_much_buffers.c.
                     super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4),0x40);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501,
                           " if flags contains MAP_PERSISTENT_BIT but does not contain at least one of MAP_READ_BIT or MAP_WRITE_BIT."
                          );
  dummy_data[3] = bVar3 & dummy_data[3];
  (**(code **)(lVar7 + 0x438))(1,&local_20);
  local_20 = 0;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1296);
  (**(code **)(lVar7 + 0x3b8))(1,&local_20);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x129d);
  (*this->m_pNamedBufferStorage)
            (local_20,4,
             (GLvoid *)
             ((long)&too_much_buffers.c.
                     super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 4),0x83);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferStorage",0x501,
                           " if flags contains MAP_COHERENT_BIT, but does not also contain MAP_PERSISTENT_BIT."
                          );
  dummy_data[3] = bVar3 & dummy_data[3];
  (**(code **)(lVar7 + 0x438))(1,&local_20);
  local_20 = 0;
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glDeleteBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x12ac);
  max_possible_size._4_4_ = 0x3f;
  _error = 0;
  for (i_2 = 0; (int)i_2 < 0x3f; i_2 = i_2 + 1) {
    _error = 1L << ((byte)i_2 & 0x3f) | _error;
  }
  tmp_buffer = 0;
  for (local_bc = 0; local_bc < 0x100; local_bc = local_bc + 1) {
    local_c0 = 0;
    (**(code **)(lVar7 + 0x3b8))(1,&local_c0);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x12c5);
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::push
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               local_78,&local_c0);
    (*this->m_pNamedBufferStorage)(local_c0,_error,(GLvoid *)0x0,3);
    tmp_buffer = (**(code **)(lVar7 + 0x800))();
    if (tmp_buffer != 0) break;
  }
  if (tmp_buffer == 0) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_240,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_240,
                         (char (*) [273])
                         "Test of NamedBufferStorage out of memory negative behavior failed to generate erroneous situation. Direct State Access Buffers Test\'s MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or the driver implementation does not inform about out of memory problem."
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_240);
  }
  else if (tmp_buffer != 0x505) {
    pTVar9 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar10 = tcu::TestContext::getLog(pTVar9);
    tcu::TestLog::operator<<(&local_3c0,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_3c0,
                         (char (*) [125])
                         "NamedBufferStorage does not generate OUT_OF_MEMORY error if the GL is unable to create a data store with the specified size."
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [20])"The error value of ");
    EVar14 = glu::getErrorStr(tmp_buffer);
    p_Stack_3e0 = EVar14.m_getName;
    local_3d8 = EVar14.m_value;
    local_3d0.m_getName = p_Stack_3e0;
    local_3d0.m_value = local_3d8;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3d0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [15])" was observed.");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3c0);
    dummy_data[3] = '\0';
  }
  if (local_20 != 0) {
    (**(code **)(lVar7 + 0x438))(1,&local_20);
    local_20 = 0;
  }
  while (bVar3 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::empty((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)local_78), GVar1 = dummy_data[3], ((bVar3 ^ 0xffU) & 1) != 0) {
    pvVar12 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              top((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                  local_78);
    local_3e4 = *pvVar12;
    if (local_3e4 != 0) {
      (**(code **)(lVar7 + 0x438))(1,&local_3e4);
    }
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::pop
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               local_78);
  }
  if ((dummy_data[2] & 1) == 0) {
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::~stack
              ((stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               local_78);
    return (bool)(GVar1 & 1);
  }
  puVar13 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar13 = 0;
  __cxa_throw(puVar13,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::TestErrorsOfNamedBufferStorage()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint				buffer		  = 0;
	glw::GLubyte			dummy_data[4] = {};
	std::stack<glw::GLuint> too_much_buffers;

	try
	{
		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pNamedBufferStorage(not_a_buffer_name, sizeof(dummy_data), dummy_data, GL_MAP_WRITE_BIT);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative or zero size error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test negative size. */
			m_pNamedBufferStorage(buffer, -1, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if size is negative.");

			/* Test zero size. */
			m_pNamedBufferStorage(buffer, 0, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if size zero.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test invalid usage bit error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			glw::GLuint valid_bits = GL_DYNAMIC_STORAGE_BIT | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT |
									 GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT | GL_CLIENT_STORAGE_BIT;

			if (m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer"))
			{
				valid_bits |= GL_SPARSE_STORAGE_BIT_ARB;
			}

			if (m_context.getContextInfo().isExtensionSupported("GL_NV_gpu_multicast") ||
				m_context.getContextInfo().isExtensionSupported("GL_NVX_linked_gpu_multicast"))
			{
				valid_bits |= GL_PER_GPU_STORAGE_BIT_NV;
			}

			glw::GLuint invalid_bits = ~valid_bits;

			glw::GLuint bits_count = CHAR_BIT * sizeof(invalid_bits);

			/* Test. */
			for (glw::GLuint i = 0; i < bits_count; ++i)
			{
				glw::GLuint possibly_invalid_bit = (1 << i);

				if (invalid_bits & possibly_invalid_bit)
				{
					/* Object creation. */
					gl.createBuffers(1, &buffer);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

					/* Test invalid bit. */
					m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data, possibly_invalid_bit);

					is_ok &=
						ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE,
										 " if flags has any bits set other than DYNAMIC_STORAGE_BIT, MAP_READ_BIT,"
										 " MAP_WRITE_BIT, MAP_PERSISTENT_BIT, MAP_COHERENT_BIT or CLIENT_STORAGE_BIT.");

					/* Release object. */
					gl.deleteBuffers(1, &buffer);

					buffer = 0;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
				}
			}
		}

		/* Test improper persistent bit behavior error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test. */
			m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data, GL_MAP_PERSISTENT_BIT);

			is_ok &= ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE, " if flags contains MAP_PERSISTENT_BIT "
																				"but does not contain at least one of "
																				"MAP_READ_BIT or MAP_WRITE_BIT.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test improper persistent bit behavior error behavior. */
		{
			/* Object creation. */
			gl.createBuffers(1, &buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

			/* Test. */
			m_pNamedBufferStorage(buffer, sizeof(dummy_data), dummy_data,
								  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_COHERENT_BIT);

			is_ok &=
				ErrorCheckAndLog("glNamedBufferStorage", GL_INVALID_VALUE,
								 " if flags contains MAP_COHERENT_BIT, but does not also contain MAP_PERSISTENT_BIT.");

			/* Clean-up. */
			gl.deleteBuffers(1, &buffer);

			buffer = 0;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
		}

		/* Test out of memory error behavior. */
		{
			/* Calculate maximum buffer size (depending on number of bits of function argument). */
			glw::GLsizei max_pointer_unsigned_bits =
				(CHAR_BIT * sizeof(glw::GLsizeiptr) - 1) /* do not include possible sign bit */;
			glw::GLsizeiptr max_possible_size = 0;

			for (glw::GLsizei i = 0; i < max_pointer_unsigned_bits; ++i)
			{
				max_possible_size |= ((glw::GLsizeiptr)1 << i);
			}

			/* Error storing variable. */
			glw::GLenum error = GL_NO_ERROR;

			/* Try to overflow by allocating biggest possible buffers in a loop. */
			for (glw::GLuint i = 0; i < MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR; ++i)
			{
				/* New big buffer creation. */
				glw::GLuint tmp_buffer = 0;

				gl.createBuffers(1, &tmp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				/* Add it to delete list. */
				too_much_buffers.push(tmp_buffer);

				/* Try to allocate big buffer storage. */
				m_pNamedBufferStorage(tmp_buffer, max_possible_size, DE_NULL, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);

				/* Check for errors. */
				error = gl.getError();

				if (error != GL_NO_ERROR)
				{
					break;
				}
			}

			if (error == GL_NO_ERROR)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Test of NamedBufferStorage out of memory negative behavior failed to "
												"generate erroneous situation. "
												"Direct State Access Buffers Test's "
												"MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or "
												"the driver implementation does not inform about out of memory problem."
					<< tcu::TestLog::EndMessage;
			}
			else
			{
				if (error != GL_OUT_OF_MEMORY)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "NamedBufferStorage does not generate OUT_OF_MEMORY error if the "
													"GL is unable to create a data store with the specified size."
						<< "The error value of " << glu::getErrorStr(error) << " was observed."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	while (!too_much_buffers.empty())
	{
		glw::GLuint tmp_buffer = too_much_buffers.top();

		if (tmp_buffer)
		{
			gl.deleteBuffers(1, &tmp_buffer);
		}

		too_much_buffers.pop();
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}